

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

int t2_encode_packet(opj_tcd_tile_t *tile,opj_tcp_t *tcp,opj_pi_iterator_t *pi,uchar *dest,
                    int length,opj_codestream_info_t *cstr_info,int tileno)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  opj_tcd_resolution_t *poVar4;
  opj_tcd_precinct_t *poVar5;
  opj_tcd_cblk_enc_t *poVar6;
  long lVar7;
  opj_packet_info_t *poVar8;
  bool bVar9;
  int iVar10;
  uchar uVar11;
  opj_bio_t *bio;
  uint uVar12;
  OPJ_UINT32 OVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint v;
  long lVar23;
  opj_tcd_layer_t *poVar24;
  uchar *puVar25;
  long lVar26;
  double dVar27;
  
  iVar22 = pi->resno;
  iVar3 = pi->precno;
  iVar10 = pi->layno;
  lVar19 = (long)iVar10;
  poVar4 = tile->comps[pi->compno].resolutions;
  puVar25 = dest;
  if ((tcp->csty & 2) != 0) {
    dest[0] = 0xff;
    dest[1] = 0x91;
    dest[2] = '\0';
    dest[3] = '\x04';
    iVar14 = tile->packno % 0x10000;
    uVar11 = (uchar)((uint)(tile->packno % 0x10000 + 0xff) >> 8);
    if (-1 < iVar14) {
      uVar11 = (uchar)((uint)iVar14 >> 8);
    }
    dest[4] = uVar11;
    dest[5] = (uchar)tile->packno;
    puVar25 = dest + 6;
  }
  if ((iVar10 == 0) && (0 < poVar4[iVar22].numbands)) {
    lVar26 = 0;
    do {
      poVar5 = poVar4[iVar22].bands[lVar26].precincts;
      tgt_reset(poVar5[iVar3].incltree);
      tgt_reset(poVar5[iVar3].imsbtree);
      if (0 < poVar5[iVar3].ch * poVar5[iVar3].cw) {
        lVar23 = 0x30;
        lVar15 = 0;
        do {
          poVar6 = poVar5[iVar3].cblks.enc;
          *(undefined4 *)((long)&poVar6->data + lVar23) = 0;
          tgt_setvalue(poVar5[iVar3].imsbtree,(OPJ_UINT32)lVar15,
                       poVar4[iVar22].bands[lVar26].numbps - *(int *)((long)poVar6 + lVar23 + -8));
          lVar15 = lVar15 + 1;
          lVar23 = lVar23 + 0x40;
        } while (lVar15 < (long)poVar5[iVar3].ch * (long)poVar5[iVar3].cw);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < poVar4[iVar22].numbands);
  }
  bio = bio_create();
  bio_init_enc(bio,puVar25,length);
  bio_write(bio,1,1);
  if (0 < poVar4[iVar22].numbands) {
    lVar26 = 0;
    do {
      poVar5 = poVar4[iVar22].bands[lVar26].precincts;
      iVar14 = poVar5[iVar3].cw;
      iVar18 = poVar5[iVar3].ch;
      if (0 < iVar18 * iVar14) {
        lVar23 = 0x30;
        lVar15 = 0;
        do {
          if ((*(int *)((long)&(poVar5[iVar3].cblks.enc)->data + lVar23) == 0) &&
             (*(int *)(*(long *)((long)poVar5[iVar3].cblks.enc + lVar23 + -0x28) + lVar19 * 0x18) !=
              0)) {
            tgt_setvalue(poVar5[iVar3].incltree,(OPJ_UINT32)lVar15,iVar10);
            iVar14 = poVar5[iVar3].cw;
            iVar18 = poVar5[iVar3].ch;
          }
          lVar15 = lVar15 + 1;
          lVar23 = lVar23 + 0x40;
        } while (lVar15 < iVar18 * iVar14);
        if (0 < iVar18 * iVar14) {
          lVar15 = 0;
          do {
            poVar6 = poVar5[iVar3].cblks.enc;
            poVar24 = poVar6[lVar15].layers + lVar19;
            if (poVar6[lVar15].numpasses == 0) {
              tgt_encode(bio,poVar5[iVar3].incltree,(OPJ_UINT32)lVar15,iVar10 + 1);
            }
            else {
              bio_write(bio,(uint)(poVar24->numpasses != 0),1);
            }
            uVar16 = poVar24->numpasses;
            if (uVar16 != 0) {
              if (poVar6[lVar15].numpasses == 0) {
                poVar6[lVar15].numlenbits = 3;
                tgt_encode(bio,poVar5[iVar3].imsbtree,(OPJ_UINT32)lVar15,999);
                uVar16 = poVar24->numpasses;
              }
              if (uVar16 == 2) {
                uVar16 = 2;
                iVar14 = 2;
LAB_0020a5b4:
                bio_write(bio,uVar16,iVar14);
              }
              else {
                if (uVar16 == 1) {
                  uVar16 = 0;
                  iVar14 = 1;
                  goto LAB_0020a5b4;
                }
                if ((int)uVar16 < 6) {
                  uVar16 = uVar16 - 3 | 0xc;
                  iVar14 = 4;
                  goto LAB_0020a5b4;
                }
                if (uVar16 < 0x25) {
                  uVar16 = uVar16 - 6 | 0x1e0;
                  iVar14 = 9;
                  goto LAB_0020a5b4;
                }
                if (uVar16 < 0xa5) {
                  uVar16 = uVar16 - 0x25 | 0xff80;
                  iVar14 = 0x10;
                  goto LAB_0020a5b4;
                }
              }
              uVar16 = poVar6[lVar15].numpasses;
              lVar23 = (long)(int)uVar16;
              uVar12 = poVar24->numpasses + uVar16;
              iVar14 = 0;
              uVar21 = 0;
              v = 0;
              if (uVar16 < uVar12) {
                iVar14 = 0;
                uVar21 = 0;
                v = 0;
                do {
                  v = v + poVar6[lVar15].passes[lVar23].len;
                  if ((lVar23 == (int)(uVar12 - 1)) ||
                     (uVar16 = uVar21 + 1, poVar6[lVar15].passes[lVar23].term != 0)) {
                    iVar18 = 1;
                    if (1 < (int)v) {
                      do {
                        iVar18 = iVar18 + 1;
                        bVar9 = 3 < v;
                        v = v >> 1;
                      } while (bVar9);
                    }
                    v = 0;
                    iVar20 = 0;
                    if (0 < (int)uVar21) {
                      iVar20 = 0;
                      uVar16 = uVar21 + 1;
                      do {
                        iVar20 = iVar20 + -1;
                        bVar9 = 3 < uVar16;
                        uVar16 = uVar16 >> 1;
                      } while (bVar9);
                    }
                    iVar20 = (iVar18 - poVar6[lVar15].numlenbits) + iVar20;
                    if (iVar14 <= iVar20) {
                      iVar14 = iVar20;
                    }
                    uVar16 = 0;
                  }
                  uVar21 = uVar16;
                  lVar23 = lVar23 + 1;
                } while ((uint)lVar23 < uVar12);
                if (0 < iVar14) {
                  uVar16 = iVar14 + 1;
                  do {
                    bio_write(bio,1,1);
                    uVar16 = uVar16 - 1;
                  } while (1 < uVar16);
                }
              }
              bio_write(bio,0,1);
              poVar6[lVar15].numlenbits = poVar6[lVar15].numlenbits + iVar14;
              uVar12 = poVar6[lVar15].numpasses;
              OVar13 = poVar24->numpasses;
              uVar16 = OVar13 + uVar12;
              if (uVar12 < uVar16) {
                lVar23 = (long)(int)uVar12;
                do {
                  v = v + poVar6[lVar15].passes[lVar23].len;
                  if ((uVar16 - 1 == (int)lVar23) ||
                     (uVar16 = uVar21 + 1, poVar6[lVar15].passes[lVar23].term != 0)) {
                    iVar14 = 0;
                    if (0 < (int)uVar21) {
                      iVar14 = 0;
                      uVar17 = (ulong)(uVar21 + 1);
                      do {
                        iVar14 = iVar14 + 1;
                        uVar16 = (uint)uVar17;
                        uVar17 = uVar17 >> 1;
                      } while (3 < uVar16);
                    }
                    bio_write(bio,v,iVar14 + poVar6[lVar15].numlenbits);
                    uVar12 = poVar6[lVar15].numpasses;
                    OVar13 = poVar24->numpasses;
                    v = 0;
                    uVar16 = 0;
                  }
                  uVar21 = uVar16;
                  lVar23 = lVar23 + 1;
                  uVar16 = OVar13 + uVar12;
                } while ((uint)lVar23 < uVar16);
              }
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < (long)poVar5[iVar3].ch * (long)poVar5[iVar3].cw);
        }
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < poVar4[iVar22].numbands);
  }
  iVar10 = bio_flush(bio);
  if (iVar10 == 0) {
    iVar10 = bio_numbytes(bio);
    puVar25 = puVar25 + iVar10;
    bio_destroy(bio);
    if ((tcp->csty & 4) != 0) {
      puVar25[0] = 0xff;
      puVar25[1] = 0x92;
      puVar25 = puVar25 + 2;
    }
    if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
      cstr_info->tile[tileno].packet[cstr_info->packno].end_ph_pos =
           (long)((int)puVar25 - (int)dest);
    }
    iVar10 = poVar4[iVar22].numbands;
    if (0 < iVar10) {
      lVar26 = 0;
      do {
        poVar5 = poVar4[iVar22].bands[lVar26].precincts;
        if (0 < poVar5[iVar3].ch * poVar5[iVar3].cw) {
          lVar15 = 0x30;
          lVar23 = 0;
          do {
            poVar6 = poVar5[iVar3].cblks.enc;
            lVar7 = *(long *)((long)poVar6 + lVar15 + -0x28);
            if (*(int *)(lVar7 + lVar19 * 0x18) != 0) {
              piVar1 = (int *)(lVar7 + lVar19 * 0x18);
              if (dest + length < puVar25 + (uint)piVar1[1]) goto LAB_0020a771;
              memcpy(puVar25,*(void **)(piVar1 + 4),(ulong)(uint)piVar1[1]);
              piVar2 = (int *)((long)&poVar6->data + lVar15);
              *piVar2 = *piVar2 + *piVar1;
              puVar25 = puVar25 + (uint)piVar1[1];
              if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
                poVar8 = cstr_info->tile[tileno].packet;
                dVar27 = poVar8[cstr_info->packno].disto + *(double *)(piVar1 + 2);
                poVar8[cstr_info->packno].disto = dVar27;
                if (cstr_info->D_max <= dVar27 && dVar27 != cstr_info->D_max) {
                  cstr_info->D_max = dVar27;
                }
              }
            }
            lVar23 = lVar23 + 1;
            lVar15 = lVar15 + 0x40;
          } while (lVar23 < (long)poVar5[iVar3].ch * (long)poVar5[iVar3].cw);
          iVar10 = poVar4[iVar22].numbands;
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < iVar10);
    }
    iVar22 = (int)puVar25 - (int)dest;
  }
  else {
    bio_destroy(bio);
LAB_0020a771:
    iVar22 = -999;
  }
  return iVar22;
}

Assistant:

static int t2_encode_packet(opj_tcd_tile_t * tile, opj_tcp_t * tcp, opj_pi_iterator_t *pi, unsigned char *dest, int length, opj_codestream_info_t *cstr_info, int tileno) {
	int bandno, cblkno;
	unsigned char *c = dest;

	int compno = pi->compno;	/* component value */
	int resno  = pi->resno;		/* resolution level value */
	int precno = pi->precno;	/* precinct value */
	int layno  = pi->layno;		/* quality layer value */

	opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
	opj_tcd_resolution_t *res = &tilec->resolutions[resno];
	
	opj_bio_t *bio = NULL;	/* BIO component */
	
	/* <SOP 0xff91> */
	if (tcp->csty & J2K_CP_CSTY_SOP) {
		c[0] = 255;
		c[1] = 145;
		c[2] = 0;
		c[3] = 4;
		c[4] = (unsigned char)((tile->packno % 65536) / 256);
		c[5] = (unsigned char)((tile->packno % 65536) % 256);
		c += 6;
	}
	/* </SOP> */
	
	if (!layno) {
		for (bandno = 0; bandno < res->numbands; bandno++) {
			opj_tcd_band_t *band = &res->bands[bandno];
			opj_tcd_precinct_t *prc = &band->precincts[precno];
			tgt_reset(prc->incltree);
			tgt_reset(prc->imsbtree);
			for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
				opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
				cblk->numpasses = 0;
				tgt_setvalue(prc->imsbtree, cblkno, band->numbps - cblk->numbps);
			}
		}
	}
	
	bio = bio_create();
	bio_init_enc(bio, c, length);
	bio_write(bio, 1, 1);		/* Empty header bit */
	
	/* Writing Packet header */
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			if (!cblk->numpasses && layer->numpasses) {
				tgt_setvalue(prc->incltree, cblkno, layno);
			}
		}
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			int increment = 0;
			int nump = 0;
			int len = 0, passno;
			/* cblk inclusion bits */
			if (!cblk->numpasses) {
				tgt_encode(bio, prc->incltree, cblkno, layno + 1);
			} else {
				bio_write(bio, layer->numpasses != 0, 1);
			}
			/* if cblk not included, go to the next cblk  */
			if (!layer->numpasses) {
				continue;
			}
			/* if first instance of cblk --> zero bit-planes information */
			if (!cblk->numpasses) {
				cblk->numlenbits = 3;
				tgt_encode(bio, prc->imsbtree, cblkno, 999);
			}
			/* number of coding passes included */
			t2_putnumpasses(bio, layer->numpasses);
			
			/* computation of the increase of the length indicator and insertion in the header     */
			for (passno = cblk->numpasses; passno < cblk->numpasses + layer->numpasses; passno++) {
				opj_tcd_pass_t *pass = &cblk->passes[passno];
				nump++;
				len += pass->len;
				if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
					increment = int_max(increment, int_floorlog2(len) + 1 - (cblk->numlenbits + int_floorlog2(nump)));
					len = 0;
					nump = 0;
				}
			}
			t2_putcommacode(bio, increment);

			/* computation of the new Length indicator */
			cblk->numlenbits += increment;

			/* insertion of the codeword segment length */
			for (passno = cblk->numpasses; passno < cblk->numpasses + layer->numpasses; passno++) {
				opj_tcd_pass_t *pass = &cblk->passes[passno];
				nump++;
				len += pass->len;
				if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
					bio_write(bio, len, cblk->numlenbits + int_floorlog2(nump));
					len = 0;
					nump = 0;
				}
			}
		}
	}

	if (bio_flush(bio)) {
		bio_destroy(bio);
		return -999;		/* modified to eliminate longjmp !! */
	}

	c += bio_numbytes(bio);
	bio_destroy(bio);
	
	/* <EPH 0xff92> */
	if (tcp->csty & J2K_CP_CSTY_EPH) {
		c[0] = 255;
		c[1] = 146;
		c += 2;
	}
	/* </EPH> */

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	// Will be updated later by incrementing with packet start value */
	if(cstr_info && cstr_info->index_write) {
		opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
		info_PK->end_ph_pos = (int)(c - dest);
	}
	/* INDEX >> */
	
	/* Writing the packet body */
	
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			if (!layer->numpasses) {
				continue;
			}
			if (c + layer->len > dest + length) {
				return -999;
			}
			
			memcpy(c, layer->data, layer->len);
			cblk->numpasses += layer->numpasses;
			c += layer->len;
			/* << INDEX */ 
			if(cstr_info && cstr_info->index_write) {
				opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
				info_PK->disto += layer->disto;
				if (cstr_info->D_max < info_PK->disto) {
					cstr_info->D_max = info_PK->disto;
				}
			}
			/* INDEX >> */
		}
	}
	
	return (c - dest);
}